

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

bool __thiscall glslang::TProgram::crossStageCheck(TProgram *this,EShMessages messages)

{
  TIntermediate *pTVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  TVector<glslang::TIntermediate_*> activeStages;
  TIntermAggregate *local_b30;
  TIntermAggregate root;
  TIntermAggregate uniformObjects;
  TIntermediate uniforms;
  
  TVector<glslang::TIntermediate_*>::TVector
            ((TVector<glslang::TIntermediate_*> *)
             &activeStages.
              super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
            );
  for (lVar3 = 0; lVar3 != 0x70; lVar3 = lVar3 + 8) {
    if (*(long *)((long)this->intermediate + lVar3) != 0) {
      std::vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>::
      push_back(&activeStages.
                 super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                ,(value_type *)((long)this->intermediate + lVar3));
    }
  }
  bVar6 = true;
  if (8 < (ulong)((long)activeStages.
                        super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        .
                        super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)activeStages.
                       super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                       .
                       super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    pTVar1 = *activeStages.
              super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
              .
              super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    TIntermediate::TIntermediate(&uniforms,EShLangCount,pTVar1->version,pTVar1->profile);
    TIntermediate::setSpv(&uniforms,&pTVar1->spvVersion);
    TIntermAggregate::TIntermAggregate(&uniformObjects,EOpLinkerObjects);
    TIntermAggregate::TIntermAggregate(&root,EOpSequence);
    local_b30 = &uniformObjects;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&root.sequence,
               (TIntermNode **)&local_b30);
    uVar2 = 0;
    uniforms.treeRoot = (TIntermNode *)&root;
    while( true ) {
      if ((ulong)((long)activeStages.
                        super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        .
                        super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)activeStages.
                        super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        .
                        super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar2) break;
      TIntermediate::mergeUniformObjects
                (&uniforms,this->infoSink,
                 activeStages.
                 super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 .
                 super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2]);
      uVar2 = uVar2 + 1;
    }
    for (uVar2 = 0;
        (ulong)uVar2 <
        (ulong)((long)activeStages.
                      super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                      .
                      super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)activeStages.
                      super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                      .
                      super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
      TIntermediate::mergeGlobalUniformBlocks
                (activeStages.
                 super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 .
                 super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar2],this->infoSink,&uniforms,true);
    }
    uVar2 = uniforms.numErrors;
    uVar5 = 0;
    while( true ) {
      uVar4 = uVar5 + 1;
      if ((ulong)((long)activeStages.
                        super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        .
                        super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)activeStages.
                        super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        .
                        super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar4) break;
      TIntermediate::checkStageIO
                (activeStages.
                 super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 .
                 super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5],this->infoSink,
                 activeStages.
                 super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 .
                 super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4]);
      uVar2 = (uint)(uVar2 != 0 ||
                    activeStages.
                    super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                    .
                    super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar5]->numErrors != 0);
      uVar5 = uVar4;
    }
    bVar6 = uVar2 == 0;
    if ((messages >> 0x12 & 1) != 0) {
      uVar2 = 0;
      while( true ) {
        uVar5 = uVar2 + 1;
        if ((ulong)((long)activeStages.
                          super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          .
                          super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)activeStages.
                          super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          .
                          super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)uVar5) break;
        TIntermediate::optimizeStageIO
                  (activeStages.
                   super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                   .
                   super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar2],this->infoSink,
                   activeStages.
                   super_vector<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                   .
                   super__Vector_base<glslang::TIntermediate_*,_glslang::pool_allocator<glslang::TIntermediate_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5]);
        uVar2 = uVar5;
      }
    }
    TIntermAggregate::~TIntermAggregate(&root);
    TIntermAggregate::~TIntermAggregate(&uniformObjects);
    TIntermediate::~TIntermediate(&uniforms);
  }
  return bVar6;
}

Assistant:

bool TProgram::crossStageCheck(EShMessages messages) {

    // make temporary intermediates to hold the linkage symbols for each linking interface
    // while we do the checks
    // Independent interfaces are:
    //                  all uniform variables and blocks
    //                  all buffer blocks
    //                  all in/out on a stage boundary

    TVector<TIntermediate*> activeStages;
    for (int s = 0; s < EShLangCount; ++s) {
        if (intermediate[s])
            activeStages.push_back(intermediate[s]);
    }

    // no extra linking if there is only one stage
    if (! (activeStages.size() > 1))
        return true;

    // setup temporary tree to hold unfirom objects from different stages
    TIntermediate* firstIntermediate = activeStages.front();
    TIntermediate uniforms(EShLangCount,
                           firstIntermediate->getVersion(),
                           firstIntermediate->getProfile());
    uniforms.setSpv(firstIntermediate->getSpv());

    TIntermAggregate uniformObjects(EOpLinkerObjects);
    TIntermAggregate root(EOpSequence);
    root.getSequence().push_back(&uniformObjects);
    uniforms.setTreeRoot(&root);

    bool error = false;

    // merge uniforms from all stages into a single intermediate
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        uniforms.mergeUniformObjects(*infoSink, *activeStages[i]);
    }
    error |= uniforms.getNumErrors() != 0;

    // copy final definition of global block back into each stage
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        // We only want to merge into already existing global uniform blocks.
        // A stage that doesn't already know about the global doesn't care about it's content.
        // Otherwise we end up pointing to the same object between different stages
        // and that will break binding/set remappings
        bool mergeExistingOnly = true;
        activeStages[i]->mergeGlobalUniformBlocks(*infoSink, uniforms, mergeExistingOnly);
    }

    // compare cross stage symbols for each stage boundary
    for (unsigned int i = 1; i < activeStages.size(); ++i) {
        activeStages[i - 1]->checkStageIO(*infoSink, *activeStages[i]);
        error |= (activeStages[i - 1]->getNumErrors() != 0);
    }

    // if requested, optimize cross stage IO
    if (messages & EShMsgLinkTimeOptimization) {
        for (unsigned int i = 1; i < activeStages.size(); ++i) {
            activeStages[i - 1]->optimizeStageIO(*infoSink, *activeStages[i]);
        }
    }

    return !error;
}